

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

shared_ptr<kratos::Property> __thiscall
kratos::Generator::property
          (Generator *this,string *property_name,shared_ptr<kratos::Sequence> *sequence)

{
  iterator iVar1;
  UserException *this_00;
  shared_ptr<kratos::Sequence> *in_RCX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>,_bool>
  pVar2;
  shared_ptr<kratos::Property> sVar3;
  format_args args;
  string_view format_str;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  undefined8 local_68;
  pointer pcStack_60;
  string local_50;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>_>
                  *)(property_name[0x25].field_2._M_local_buf + 8),(key_type *)sequence);
  if (iVar1._M_node == (_Base_ptr)(property_name + 0x26)) {
    (this->super_IRNode)._vptr_IRNode = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<kratos::Property,std::allocator<kratos::Property>,std::__cxx11::string_const&,std::shared_ptr<kratos::Sequence>const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_IRNode).fn_name_ln,
               (Property **)this,(allocator<kratos::Property> *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sequence,in_RCX)
    ;
    pVar2 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Property>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Property>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Property>>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Property>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Property>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Property>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Property>>>>
                        *)(property_name[0x25].field_2._M_local_buf + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sequence
                       ,(shared_ptr<kratos::Property> *)this);
    sVar3.super___shared_ptr<kratos::Property,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         pVar2._8_8_;
    sVar3.super___shared_ptr<kratos::Property,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<kratos::Property>)
           sVar3.super___shared_ptr<kratos::Property,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_78 = (sequence->super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Stack_70 = (sequence->super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
  local_68 = *(undefined8 *)((long)&property_name[3].field_2 + 8);
  pcStack_60 = property_name[4]._M_dataplus._M_p;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x22;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_50,(detail *)"Property {0} already exists in {1}",format_str,args);
  UserException::UserException(this_00,&local_50);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Property> Generator::property(const std::string &property_name,
                                              const std::shared_ptr<Sequence> &sequence) {
    if (properties_.find(property_name) != properties_.end())
        throw UserException(::format("Property {0} already exists in {1}", property_name, name));
    auto prop = std::make_shared<Property>(property_name, sequence);
    properties_.emplace(property_name, prop);
    return prop;
}